

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void anon_unknown.dwarf_94284::ReportAt
               (ExpressionContext *ctx,SynBase *source,char *pos,char *msg,__va_list_tag *args)

{
  Allocator *pAVar1;
  Lexeme *pLVar2;
  int iVar3;
  uint uVar4;
  ErrorInfo *in_RAX;
  char *pcVar5;
  size_t sVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ModuleData *pMVar8;
  ErrorInfo **ppEVar9;
  char *pcVar10;
  ErrorInfo *local_38;
  
  pcVar7 = ctx->errorBuf;
  local_38 = in_RAX;
  if ((pcVar7 != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = pos;
      ctx->errorBufLocation = pcVar7;
      pcVar10 = pcVar7;
    }
    else {
      pcVar10 = ctx->errorBufLocation;
    }
    vsnprintf(pcVar10,(ulong)(ctx->errorBufSize + ((int)pcVar7 - (int)pcVar10)),msg,args);
    ctx->errorBuf[ctx->errorBufSize - 1] = '\0';
    pcVar7 = ctx->errorBufLocation;
    pcVar5 = strstr(pcVar7,"%error-type%");
    if (pcVar5 != (char *)0x0) {
      pcVar7 = "strstr(ctx.errorBufLocation, \"%error-type%\") == NULL";
      uVar4 = 0x48;
      goto LAB_0016ae82;
    }
    sVar6 = strlen(pcVar7);
    ctx->errorBufLocation = pcVar7 + sVar6;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    local_38 = (ErrorInfo *)CONCAT44(extraout_var,iVar3);
    pAVar1 = ctx->allocator;
    local_38->messageStart = pcVar10;
    local_38->messageEnd = pcVar7 + sVar6;
    pLVar2 = source->end;
    local_38->begin = source->begin;
    local_38->end = pLVar2;
    local_38->pos = pos;
    (local_38->related).allocator = pAVar1;
    (local_38->related).data = (local_38->related).little;
    (local_38->related).count = 0;
    (local_38->related).max = 4;
    local_38->parentModule = (ModuleData *)0x0;
    SmallArray<ErrorInfo_*,_4U>::push_back(&ctx->errorInfo,&local_38);
    pcVar7 = FindModuleCodeWithSourceLocation(ctx,pos);
    if (pcVar7 != (char *)0x0) {
      AddErrorLocationInfo
                (pcVar7,pos,ctx->errorBufLocation,
                 (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
      pcVar10 = ctx->errorBufLocation;
      sVar6 = strlen(pcVar10);
      ctx->errorBufLocation = pcVar10 + sVar6;
      if (pcVar7 != ctx->code) {
        pMVar8 = FindModuleWithSourceLocation(ctx,(source->pos).begin);
        if (pMVar8 != (ModuleData *)0x0) {
          NULLC::SafeSprintf(ctx->errorBufLocation,
                             (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                                    ctx->errorBufSize)," [in module \'%.*s\']\n",
                             (ulong)(uint)(*(int *)&(pMVar8->name).end - (int)(pMVar8->name).begin))
          ;
          pcVar7 = ctx->errorBufLocation;
          sVar6 = strlen(pcVar7);
          ctx->errorBufLocation = pcVar7 + sVar6;
          ppEVar9 = SmallArray<ErrorInfo_*,_4U>::back(&ctx->errorInfo);
          (*ppEVar9)->parentModule = pMVar8;
        }
      }
    }
  }
  if (ctx->errorHandlerNested == true) {
    if (ctx->errorHandlerActive == false) {
      pcVar7 = "ctx.errorHandlerActive";
      uVar4 = 0x68;
      goto LAB_0016ae82;
    }
  }
  else {
    uVar4 = ctx->errorCount + 1;
    ctx->errorCount = uVar4;
    if (uVar4 != 100) {
      return;
    }
    NULLC::SafeSprintf(ctx->errorBufLocation,
                       (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                              ctx->errorBufSize),"ERROR: error limit reached");
    pcVar7 = ctx->errorBufLocation;
    sVar6 = strlen(pcVar7);
    ctx->errorBufLocation = pcVar7 + sVar6;
    if (ctx->errorHandlerActive == false) {
      pcVar7 = "ctx.errorHandlerActive";
      uVar4 = 0x75;
LAB_0016ae82:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,uVar4,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
  }
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

void ReportAt(ExpressionContext &ctx, SynBase *source, const char *pos, const char *msg, va_list args)
	{
		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = pos;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			vsnprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), msg, args);
			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';

			// Shouldn't report errors that are caused by error recovery
			assert(strstr(ctx.errorBufLocation, "%error-type%") == NULL);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			const char *messageEnd = ctx.errorBufLocation;

			ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, pos));

			if(const char *code = FindModuleCodeWithSourceLocation(ctx, pos))
			{
				AddErrorLocationInfo(code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				if(code != ctx.code)
				{
					ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

					if(parentModule)
					{
						NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

						ctx.errorBufLocation += strlen(ctx.errorBufLocation);

						ctx.errorInfo.back()->parentModule = parentModule;
					}
				}
			}
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		if(ctx.errorCount == 100)
		{
			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: error limit reached");

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}